

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-util.c
# Opt level: O2

void create_mon_flag_mask(bitflag *f,...)

{
  uint uVar1;
  char in_AL;
  uint *puVar2;
  uint uVar3;
  undefined8 in_RCX;
  ulong uVar4;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  monster_flag *pmVar5;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list args;
  uint local_e8 [2];
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  local_e0 = in_RSI;
  local_d8 = in_RDX;
  local_d0 = in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  flag_wipe(f,0xc);
  uVar3 = 0x10;
  puVar2 = (uint *)&local_e0;
  args[0].overflow_arg_area = &stack0x00000008;
  while (uVar1 = *puVar2, uVar1 != 0xf) {
    for (pmVar5 = monster_flag_table; pmVar5->index < 0x60; pmVar5 = pmVar5 + 1) {
      if (uVar1 == pmVar5->type) {
        flag_on_dbg(f,0xc,(uint)pmVar5->index,"f","rf->index");
      }
    }
    uVar4 = (ulong)uVar3;
    if (uVar4 < 0x29) {
      uVar3 = uVar3 + 8;
      puVar2 = (uint *)((long)local_e8 + uVar4);
    }
    else {
      puVar2 = (uint *)args[0].overflow_arg_area;
      args[0].overflow_arg_area = (void *)((long)args[0].overflow_arg_area + 8);
    }
  }
  return;
}

Assistant:

void create_mon_flag_mask(bitflag *f, ...)
{
	const struct monster_flag *rf;
	int i;
	va_list args;

	rf_wipe(f);

	va_start(args, f);

	/* Process each type in the va_args */
    for (i = va_arg(args, int); i != RFT_MAX; i = va_arg(args, int)) {
		for (rf = monster_flag_table; rf->index < RF_MAX; rf++)
			if (rf->type == i)
				rf_on(f, rf->index);
	}

	va_end(args);

	return;
}